

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O2

lzma_ret lzma_filters_update(lzma_stream *strm,lzma_filter *filters)

{
  lzma_internal *plVar1;
  _func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict12
  *p_Var2;
  undefined4 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  lzma_ret lVar8;
  uint64_t uVar9;
  long lVar10;
  long lVar11;
  lzma_filter *plVar12;
  bool bVar13;
  lzma_filter reversed_filters [5];
  
  plVar1 = strm->internal;
  p_Var2 = (plVar1->next).update;
  if (p_Var2 == (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict12
                 *)0x0) {
    lVar8 = LZMA_PROG_ERROR;
  }
  else {
    uVar9 = lzma_raw_encoder_memusage(filters);
    if (uVar9 == 0xffffffffffffffff) {
      lVar8 = LZMA_OPTIONS_ERROR;
    }
    else {
      lVar10 = 0;
      lVar7 = 0;
      do {
        lVar11 = lVar7;
        lVar10 = lVar10 + 1;
        lVar7 = lVar11 + 0x10;
      } while (*(long *)((long)&filters[1].id + lVar11) != -1);
      plVar12 = filters;
      puVar3 = (undefined4 *)((long)&reversed_filters[1].id + lVar11);
      while( true ) {
        bVar13 = lVar10 == 0;
        lVar10 = lVar10 + -1;
        if (bVar13) break;
        uVar4 = *(undefined4 *)((long)&plVar12->id + 4);
        uVar5 = *(undefined4 *)&plVar12->options;
        uVar6 = *(undefined4 *)((long)&plVar12->options + 4);
        puVar3[-4] = (int)plVar12->id;
        puVar3[-3] = uVar4;
        puVar3[-2] = uVar5;
        puVar3[-1] = uVar6;
        plVar12 = plVar12 + 1;
        puVar3 = puVar3 + -4;
      }
      *(undefined8 *)((long)&reversed_filters[1].id + lVar11) = 0xffffffffffffffff;
      lVar8 = (*p_Var2)((plVar1->next).coder,strm->allocator,filters,reversed_filters);
    }
  }
  return lVar8;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_update(lzma_stream *strm, const lzma_filter *filters)
{
	size_t i;
	size_t count = 1;
	lzma_filter reversed_filters[LZMA_FILTERS_MAX + 1];

	if (strm->internal->next.update == NULL)
		return LZMA_PROG_ERROR;

	// Validate the filter chain.
	if (lzma_raw_encoder_memusage(filters) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// The actual filter chain in the encoder is reversed. Some things
	// still want the normal order chain, so we provide both.
	while (filters[count].id != LZMA_VLI_UNKNOWN)
		++count;

	for (i = 0; i < count; ++i)
		reversed_filters[count - i - 1] = filters[i];

	reversed_filters[count].id = LZMA_VLI_UNKNOWN;

	return strm->internal->next.update(strm->internal->next.coder,
			strm->allocator, filters, reversed_filters);
}